

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::UntypedTimes(ExpectationBase *this,Cardinality *a_cardinality)

{
  long in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  if (*(int *)(in_RDI + 0xa4) == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,".Times() cannot appear more than once in an EXPECT_CALL().",&local_31);
    ExpectSpecProperty((ExpectationBase *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (bool)in_stack_ffffffffffffff6f,(string *)0x1116959);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    in_stack_ffffffffffffff77 = *(int *)(in_RDI + 0xa4) < 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,
               ".Times() may only appear *before* .InSequence(), .WillOnce(), .WillRepeatedly(), or .RetiresOnSaturation(), not after."
               ,&local_69);
    ExpectSpecProperty((ExpectationBase *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (bool)in_stack_ffffffffffffff6f,(string *)0x1116a00);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  *(undefined4 *)(in_RDI + 0xa4) = 2;
  SpecifyCardinality((ExpectationBase *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     (Cardinality *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  return;
}

Assistant:

void ExpectationBase::UntypedTimes(const Cardinality& a_cardinality) {
  if (last_clause_ == kTimes) {
    ExpectSpecProperty(false,
                       ".Times() cannot appear "
                       "more than once in an EXPECT_CALL().");
  } else {
    ExpectSpecProperty(
        last_clause_ < kTimes,
        ".Times() may only appear *before* .InSequence(), .WillOnce(), "
        ".WillRepeatedly(), or .RetiresOnSaturation(), not after.");
  }
  last_clause_ = kTimes;

  SpecifyCardinality(a_cardinality);
}